

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O2

MUSTACHE_TEMPLATE *
mustache_compile(char *templ_data,size_t templ_size,MUSTACHE_PARSER *parser,void *parser_data,
                uint flags)

{
  char *__src;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint8_t *__ptr;
  char cVar7;
  int iVar8;
  int iVar9;
  MUSTACHE_PARSER *pMVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  byte bVar16;
  size_t sVar17;
  int *piVar18;
  int *piVar19;
  ulong unaff_RBP;
  long lVar20;
  ulong uVar21;
  uint64_t num;
  off_t off;
  ulong uVar22;
  int *piVar23;
  ulong uVar24;
  int *piVar25;
  long lVar26;
  MUSTACHE_TEMPLATE *pMVar27;
  bool bVar28;
  uint64_t uStack_1d0;
  int local_1ac;
  size_t local_1a8;
  long local_198;
  ulong local_190;
  ulong local_188;
  long local_160;
  long local_150;
  long local_148;
  long local_140;
  undefined4 local_130 [2];
  long local_128;
  long local_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong local_100;
  MUSTACHE_STACK local_f8;
  MUSTACHE_BUFFER insns;
  MUSTACHE_BUFFER local_b8;
  MUSTACHE_STACK local_98;
  char closer [32];
  char opener [32];
  
  insns.data = (uint8_t *)0x0;
  insns.n = 0;
  insns.alloc = 0;
  local_f8.data = (uint8_t *)0x0;
  local_f8.n = 0;
  local_f8.alloc = 0;
  pMVar10 = &mustache_compile::default_parser;
  if (parser != (MUSTACHE_PARSER *)0x0) {
    pMVar10 = parser;
  }
  opener[0x10] = '\0';
  opener[0x11] = '\0';
  opener[0x12] = '\0';
  opener[0x13] = '\0';
  opener[0x14] = '\0';
  opener[0x15] = '\0';
  opener[0x16] = '\0';
  opener[0x17] = '\0';
  opener[0x18] = '\0';
  opener[0x19] = '\0';
  opener[0x1a] = '\0';
  opener[0x1b] = '\0';
  opener[0x1c] = '\0';
  opener[0x1d] = '\0';
  opener[0x1e] = '\0';
  opener[0x1f] = '\0';
  opener[0] = '{';
  opener[1] = '{';
  opener[2] = '\0';
  opener[3] = '\0';
  opener[4] = '\0';
  opener[5] = '\0';
  opener[6] = '\0';
  opener[7] = '\0';
  opener[8] = '\0';
  opener[9] = '\0';
  opener[10] = '\0';
  opener[0xb] = '\0';
  opener[0xc] = '\0';
  opener[0xd] = '\0';
  opener[0xe] = '\0';
  opener[0xf] = '\0';
  closer[0x10] = '\0';
  closer[0x11] = '\0';
  closer[0x12] = '\0';
  closer[0x13] = '\0';
  closer[0x14] = '\0';
  closer[0x15] = '\0';
  closer[0x16] = '\0';
  closer[0x17] = '\0';
  closer[0x18] = '\0';
  closer[0x19] = '\0';
  closer[0x1a] = '\0';
  closer[0x1b] = '\0';
  closer[0x1c] = '\0';
  closer[0x1d] = '\0';
  closer[0x1e] = '\0';
  closer[0x1f] = '\0';
  closer[0] = '}';
  closer[1] = '}';
  closer[2] = '\0';
  closer[3] = '\0';
  closer[4] = '\0';
  closer[5] = '\0';
  closer[6] = '\0';
  closer[7] = '\0';
  closer[8] = '\0';
  closer[9] = '\0';
  closer[10] = '\0';
  closer[0xb] = '\0';
  closer[0xc] = '\0';
  closer[0xd] = '\0';
  closer[0xe] = '\0';
  closer[0xf] = '\0';
  local_b8.data = (uint8_t *)0x0;
  local_b8.n = 0;
  local_b8.alloc = 0;
  if (templ_size == 0) {
LAB_00106f44:
    local_130[0] = 0;
    local_160 = 1;
    local_1a8 = 2;
    uVar22 = 0;
    uVar2 = 0;
    local_1ac = 0;
    local_190 = 0;
    local_150 = 1;
    sVar17 = local_1a8;
    do {
      __src = templ_data + unaff_RBP;
      uVar12 = local_190;
      local_188 = uVar22;
LAB_00106fb2:
      lVar11 = local_1a8 + uVar12;
      lVar26 = uVar12 + sVar17;
      lVar20 = 0;
      uVar24 = uVar12;
      while( true ) {
        puVar6 = local_b8.data;
        uVar22 = uVar12 + lVar20;
        if (templ_size <= uVar22) {
          lVar26 = 0;
          uVar22 = local_b8.n / 0x38;
          local_98.alloc = 0;
          local_98.data = (uint8_t *)0x0;
          local_98.n = 0;
          iVar8 = 0;
          goto LAB_00107a24;
        }
        uVar3 = (uint)local_148;
        uVar4 = (uint)local_140;
        if ((ulong)(lVar26 + lVar20) <= templ_size) break;
        local_190 = lVar11 + lVar20;
        if (local_190 <= templ_size) {
          bVar28 = false;
LAB_0010705c:
          iVar8 = bcmp(templ_data + lVar20 + uVar12,closer,local_1a8);
          uVar5 = (uint)local_150;
          if ((bVar28) && (iVar8 == 0)) {
            if (uVar2 == 0) goto LAB_001077e4;
LAB_00107215:
            uVar22 = uVar12 + lVar20;
            local_198 = local_1a8 + local_160 + lVar20;
            if (uVar2 != 1) {
              if (uVar2 != 4) goto LAB_00107389;
              if (((long)unaff_RBP < (long)uVar22) && (templ_data[lVar20 + -1 + uVar12] == '}')) {
                uVar22 = (uVar12 + lVar20) - 1;
                uStack_110 = local_190;
                goto LAB_001074c5;
              }
              sVar14 = 0;
              goto LAB_00107320;
            }
            cVar7 = templ_data[lVar20 + -1 + uVar12];
            if ((cVar7 == '=') || (templ_size <= local_190 + local_1a8)) {
LAB_001073b7:
              if (cVar7 == '=') {
                if ((long)unaff_RBP < (long)uVar22) {
                  uVar22 = uVar22 - 1;
                }
                goto LAB_00107408;
              }
            }
            else if ((templ_data[local_190] == '=') &&
                    (iVar8 = bcmp(templ_data + local_190 + 1,closer,local_1a8), iVar8 == 0)) {
              uVar22 = lVar11 + lVar20 + 1;
              local_190 = local_190 + local_1a8 + 1;
              local_198 = local_160 + local_1a8 * 2 + lVar20 + 1;
              cVar7 = templ_data[lVar11 + lVar20];
              goto LAB_001073b7;
            }
            (*pMVar10->parse_error)
                      (3,"Tag closer is incompatible with its opener.",uVar5,(uint)local_198,
                       parser_data);
            local_1ac = local_1ac + 1;
            goto LAB_00107408;
          }
          if (bVar28) goto LAB_001077a8;
          if (iVar8 == 0 && uVar2 == 0) {
            (*pMVar10->parse_error)
                      (2,"Tag closer has no opener.",uVar5,(int)local_160 + (int)lVar20,parser_data)
            ;
            local_1ac = local_1ac + 1;
            local_160 = local_160 + 1 + lVar20;
            uVar2 = 0;
            uVar12 = uVar12 + lVar20 + 1;
            goto LAB_00106fb2;
          }
          if (iVar8 == 0) goto LAB_00107215;
        }
LAB_00107098:
        cVar7 = templ_data[lVar20 + uVar12];
        if ((cVar7 == '\r') || (cVar7 == '\n')) goto LAB_00107102;
        uVar24 = uVar24 + 1;
        lVar20 = lVar20 + 1;
      }
      iVar8 = bcmp(templ_data + lVar20 + uVar12,opener,sVar17);
      bVar28 = iVar8 == 0;
      if ((ulong)(lVar11 + lVar20) <= templ_size) {
        local_190 = local_1a8 + uVar24;
        goto LAB_0010705c;
      }
      if (iVar8 != 0) goto LAB_00107098;
LAB_001077a8:
      if ((uVar2 & 0xfffffffd) != 0) {
        (*pMVar10->parse_error)(1,"Tag opener has no closer.",uVar3,uVar4,parser_data);
        local_1ac = local_1ac + 1;
        local_130[0] = 0;
LAB_001077e4:
        uVar2 = 0;
      }
      local_128 = local_150;
      local_140 = local_160 + lVar20;
      uVar24 = uVar22 + sVar17;
      if (uVar24 < templ_size) {
        cVar7 = templ_data[lVar20 + sVar17 + uVar12];
        if (cVar7 == '!') {
          local_130[0] = 2;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 2;
        }
        else if (cVar7 == '#') {
          local_130[0] = 6;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 6;
        }
        else if (cVar7 == '&') {
          local_130[0] = 5;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 5;
        }
        else if (cVar7 == '/') {
          local_130[0] = 8;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 8;
        }
        else if (cVar7 == '{') {
          local_130[0] = 4;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 4;
        }
        else if (cVar7 == '>') {
          local_130[0] = 10;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 10;
        }
        else if (cVar7 == '^') {
          local_130[0] = 7;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 7;
        }
        else if (cVar7 == '=') {
          local_130[0] = 1;
          uVar24 = lVar20 + lVar26 + 1;
          uVar2 = 1;
        }
        else {
          local_130[0] = 3;
          uVar2 = 3;
        }
      }
      sVar13 = templ_size;
      if (templ_size < uVar24) {
        sVar13 = uVar24;
      }
      while (((unaff_RBP = sVar13, sVar13 != uVar24 &&
              (unaff_RBP = uVar24, (ulong)(byte)templ_data[uVar24] < 0x21)) &&
             ((0x100001a00U >> ((ulong)(byte)templ_data[uVar24] & 0x3f) & 1) != 0))) {
        uVar24 = uVar24 + 1;
      }
      local_160 = (local_140 - uVar22) + unaff_RBP;
      local_148 = local_150;
      local_190 = unaff_RBP;
      local_120 = local_140;
      local_118 = uVar22;
      local_108 = unaff_RBP;
    } while( true );
  }
  local_130[0] = 0xb;
  local_118 = 0;
  uStack_110 = 0;
  iVar8 = mustache_buffer_append(&local_b8,local_130,0x38);
  if (iVar8 == 0) goto LAB_00106f44;
  goto LAB_00107ede;
LAB_00107a24:
  __ptr = local_98.data;
  if ((uVar22 & 0xffffffff) * 0x38 == lVar26) goto LAB_00107b48;
  if (*(int *)((long)puVar6 + lVar26) - 8U < 2) {
    if (local_98.n == 0) {
      (*pMVar10->parse_error)
                (7,"Section-closing tag has no opener.",*(uint *)((long)puVar6 + lVar26 + 8),
                 *(uint *)((long)puVar6 + lVar26 + 0x10),parser_data);
      iVar8 = iVar8 + 1;
    }
    else {
      piVar23 = *(int **)(local_98.data + (local_98.n - 8));
      local_98.n = local_98.n - 8;
      sVar17 = *(long *)(piVar23 + 0xc) - *(long *)(piVar23 + 10);
      lVar11 = *(long *)((long)puVar6 + lVar26 + 0x28);
      if ((sVar17 != *(long *)((long)puVar6 + lVar26 + 0x30) - lVar11) ||
         (iVar9 = strncmp(templ_data + *(long *)(piVar23 + 10),templ_data + lVar11,sVar17),
         iVar9 != 0)) {
        (*pMVar10->parse_error)
                  (8,"Name of section-closing tag does not match corresponding section-opening tag."
                   ,*(uint *)((long)puVar6 + lVar26 + 8),*(uint *)((long)puVar6 + lVar26 + 0x10),
                   parser_data);
        (*pMVar10->parse_error)
                  (9,"The section-opening is located here.",piVar23[2],piVar23[4],parser_data);
        iVar8 = iVar8 + 1;
      }
      if (*piVar23 == 7) {
        *(undefined4 *)((long)puVar6 + lVar26) = 9;
      }
    }
  }
  else if ((*(int *)((long)puVar6 + lVar26) - 6U < 2) &&
          (iVar9 = mustache_stack_push(&local_98,(long)puVar6 + lVar26), iVar9 != 0)) {
    free(local_98.data);
    goto LAB_00107ede;
  }
  lVar26 = lVar26 + 0x38;
  goto LAB_00107a24;
switchD_00107c6a_caseD_0:
  iVar8 = mustache_buffer_append_num(&insns,0);
  piVar18 = (int *)local_f8.data;
  piVar19 = (int *)local_f8.data;
  piVar25 = (int *)insns.data;
  pMVar27 = (MUSTACHE_TEMPLATE *)insns.data;
  if (iVar8 == 0) goto LAB_00107f04;
  goto LAB_00107ef3;
  while (pcVar1 = closer + sVar14, sVar14 = sVar14 + 1, *pcVar1 == '}') {
LAB_00107320:
    if (local_1a8 == sVar14) {
      if ((local_190 < templ_size) && (templ_data[local_190] == '}')) {
        local_190 = local_190 + 1;
        local_198 = local_1a8 + local_160 + lVar20 + 1;
        goto LAB_00107389;
      }
      break;
    }
  }
  (*pMVar10->parse_error)
            (3,"Tag closer is incompatible with its opener.",uVar5,
             (int)lVar20 + (int)local_160 + (int)local_1a8,parser_data);
  local_1ac = local_1ac + 1;
LAB_00107389:
  uStack_110 = local_190;
  if (uVar2 - 6 < 0xfffffffd) {
LAB_00107408:
    uStack_110 = local_190;
    if (((templ_size <= local_190) || (templ_data[local_190] == '\r')) ||
       (templ_data[local_190] == '\n')) {
      uVar24 = (long)local_188 >> 0x3f & local_188;
      for (uVar12 = local_188; 0 < (long)uVar12; uVar12 = uVar12 - 1) {
        bVar16 = templ_data[uVar12 - 1];
        if ((0x20 < (ulong)bVar16) || ((0x100001a00U >> ((ulong)bVar16 & 0x3f) & 1) == 0))
        goto LAB_00107466;
      }
      if ((long)local_188 < 0) {
        bVar16 = templ_data[uVar24 - 1];
        uVar12 = uVar24;
LAB_00107466:
        if ((bVar16 != 0xd) && (bVar16 != 10)) goto LAB_001074c5;
      }
      else {
        uVar12 = 0;
      }
      if ((local_190 < templ_size) && (templ_data[local_190] == '\r')) {
        uStack_110 = local_190 + 1;
      }
      local_188 = uVar12;
      local_118 = uVar12;
      if ((uStack_110 < templ_size) && (templ_data[uStack_110] == '\n')) {
        uStack_110 = uStack_110 + 1;
      }
    }
  }
LAB_001074c5:
  uVar12 = unaff_RBP;
  if ((long)uVar22 < (long)unaff_RBP) {
    uVar12 = uVar22;
  }
  for (; (long)unaff_RBP < (long)uVar22; uVar22 = uVar22 - 1) {
    if ((0x20 < (ulong)(byte)templ_data[uVar22 - 1]) ||
       ((0x100001a00U >> ((ulong)(byte)templ_data[uVar22 - 1] & 0x3f) & 1) == 0)) {
      local_100 = uVar22;
      if (uVar2 == 2) goto LAB_00107763;
      goto LAB_0010753e;
    }
  }
  local_100 = uVar12;
  if (uVar2 == 2) goto LAB_00107763;
  (*pMVar10->parse_error)(4,"Tag has no name.",uVar3,uVar4,parser_data);
  local_1ac = local_1ac + 1;
  uVar22 = uVar12;
LAB_0010753e:
  uVar12 = uVar22 - unaff_RBP;
  if (uVar2 != 1) {
    if (*__src == '.') {
      if (uVar12 == 1) goto LAB_00107763;
    }
    else if (templ_data[uVar22 - 1] != '.') {
      uVar22 = 0;
      do {
        while( true ) {
          if (uVar22 == uVar12) goto LAB_00107763;
          uVar24 = (ulong)(byte)__src[uVar22];
          if (uVar24 < 0x2f) break;
LAB_00107627:
          uVar22 = uVar22 + 1;
        }
        if (uVar24 != 0x2e) {
          if ((0x100001a00U >> (uVar24 & 0x3f) & 1) == 0) goto LAB_00107627;
          break;
        }
        uVar22 = uVar22 + 1;
      } while ((uVar12 <= uVar22) || (__src[uVar22] != '.'));
    }
    (*pMVar10->parse_error)(5,"Tag name is invalid.",uVar3,uVar4,parser_data);
    local_1ac = local_1ac + 1;
    goto LAB_00107763;
  }
  for (uVar22 = 0; uVar24 = uVar12, uVar12 != uVar22; uVar22 = uVar22 + 1) {
    uVar15 = (ulong)(byte)__src[uVar22];
    if (uVar15 < 0x3e) {
      uVar24 = uVar22;
      if ((0x100001a00U >> (uVar15 & 0x3f) & 1) != 0) break;
      if (uVar15 == 0x3d) goto LAB_00107729;
    }
  }
  if (uVar24 - 0x21 < 0xffffffffffffffe0) {
LAB_00107729:
    (*pMVar10->parse_error)(10,"Invalid specification of delimiters.",uVar3,uVar4,parser_data);
    local_1ac = local_1ac + 1;
    sVar14 = local_1a8;
    uVar24 = sVar17;
  }
  else {
    uVar22 = uVar24;
    uVar15 = uVar12;
    if (uVar12 < uVar24) {
      uVar15 = uVar24;
    }
    while (((uVar21 = uVar15, uVar22 < uVar12 &&
            (uVar21 = uVar22, (ulong)(byte)__src[uVar22] < 0x21)) &&
           ((0x100001a00U >> ((ulong)(byte)__src[uVar22] & 0x3f) & 1) != 0))) {
      uVar22 = uVar22 + 1;
    }
    uVar22 = uVar21;
    if (uVar21 <= uVar24) goto LAB_00107729;
    for (; uVar22 < uVar12; uVar22 = uVar22 + 1) {
      if (((ulong)(byte)__src[uVar22] < 0x21) &&
         ((0x100001a00U >> ((ulong)(byte)__src[uVar22] & 0x3f) & 1) != 0)) goto LAB_00107729;
    }
    if (uVar12 <= uVar21) goto LAB_00107729;
    sVar14 = 0;
    if (uVar21 <= uVar12) {
      sVar14 = uVar12 - uVar21;
    }
    if (0x20 < (long)sVar14) goto LAB_00107729;
    memcpy(opener,__src,uVar24);
    memcpy(closer,__src + uVar21,sVar14);
  }
  local_130[0] = 2;
  local_1a8 = sVar14;
  sVar17 = uVar24;
LAB_00107763:
  iVar8 = mustache_buffer_append(&local_b8,local_130,0x38);
  if (iVar8 != 0) goto LAB_00107ede;
  local_130[0] = 0;
  uVar2 = 0;
  uVar12 = local_190;
  local_160 = local_198;
  goto LAB_00106fb2;
LAB_00107102:
  if ((uVar2 & 0xfffffffd) != 0) {
    (*pMVar10->parse_error)(1,"Tag opener has no closer.",uVar3,uVar4,parser_data);
    local_130[0] = 0;
    local_1ac = local_1ac + 1;
    cVar7 = templ_data[lVar20 + uVar12];
    uVar2 = 0;
  }
  uVar22 = (ulong)(cVar7 == '\r');
  uVar24 = uVar12 + lVar20 + uVar22;
  if (uVar24 < templ_size) {
    uVar24 = uVar12 + uVar22 + lVar20 + (ulong)(templ_data[lVar20 + uVar22 + uVar12] == '\n');
  }
  if ((uVar2 == 0) && (uVar24 < templ_size)) {
    local_130[0] = 0xb;
    local_118 = uVar24;
    uStack_110 = uVar24;
    iVar8 = mustache_buffer_append(&local_b8,local_130,0x38);
    if (iVar8 != 0) goto LAB_00107ede;
    local_130[0] = 0;
    uVar2 = 0;
    local_188 = uVar24;
  }
  local_150 = local_150 + 1;
  local_160 = 1;
  uVar12 = uVar24;
  goto LAB_00106fb2;
LAB_00107b48:
  sVar13 = local_98.n;
  if (local_98.n != 0) {
    for (; sVar13 != 0; sVar13 = sVar13 - 8) {
      lVar26 = *(long *)(__ptr + (sVar13 - 8));
      (*pMVar10->parse_error)
                (6,"Section-opening tag has no closer.",*(uint *)(lVar26 + 8),
                 *(uint *)(lVar26 + 0x10),parser_data);
      iVar8 = iVar8 + 1;
    }
  }
  free(__ptr);
  if (iVar8 == 0) {
    local_130[0] = 0;
    local_118 = templ_size;
    uStack_110 = templ_size;
    iVar8 = mustache_buffer_append(&local_b8,local_130,0x38);
    piVar23 = (int *)local_b8.data;
    if (iVar8 == 0 && local_1ac == 0) {
      lVar26 = 0;
      piVar19 = (int *)local_b8.data;
      do {
        if ((lVar26 < *(long *)(piVar19 + 6)) &&
           (((iVar8 = mustache_buffer_append_num(&insns,1), piVar18 = (int *)local_f8.data,
             piVar25 = (int *)insns.data, iVar8 != 0 ||
             (iVar8 = mustache_buffer_append_num(&insns,*(long *)(piVar19 + 6) - lVar26),
             piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 != 0)) ||
            (iVar8 = mustache_buffer_append
                               (&insns,templ_data + lVar26,*(long *)(piVar19 + 6) - lVar26),
            piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 != 0))))
        goto LAB_00107ef3;
        switch(*piVar19) {
        case 0:
          goto switchD_00107c6a_caseD_0;
        default:
          goto switchD_00107c6a_caseD_1;
        case 3:
        case 4:
        case 5:
          iVar8 = mustache_buffer_append_num(&insns,3);
          piVar18 = (int *)local_f8.data;
          piVar25 = (int *)insns.data;
          if ((iVar8 == 0) &&
             (iVar8 = mustache_compile_tagname
                                (&insns,templ_data + *(long *)(piVar19 + 10),
                                 *(long *)(piVar19 + 0xc) - *(long *)(piVar19 + 10)),
             piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 == 0)) {
            uStack_1d0 = (ulong)(*piVar19 == 3) | 4;
            goto LAB_00107d6d;
          }
          goto LAB_00107ef3;
        case 6:
          iVar8 = mustache_buffer_append_num(&insns,2);
          piVar18 = (int *)local_f8.data;
          piVar25 = (int *)insns.data;
          if (((iVar8 != 0) ||
              (iVar8 = mustache_stack_push(&local_f8,insns.n), piVar18 = (int *)local_f8.data,
              piVar25 = (int *)insns.data, iVar8 != 0)) ||
             ((iVar8 = mustache_compile_tagname
                                 (&insns,templ_data + *(long *)(piVar19 + 10),
                                  *(long *)(piVar19 + 0xc) - *(long *)(piVar19 + 10)),
              piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 != 0 ||
              (iVar8 = mustache_buffer_append_num(&insns,6), piVar18 = (int *)local_f8.data,
              piVar25 = (int *)insns.data, iVar8 != 0)))) goto LAB_00107ef3;
          iVar8 = mustache_stack_push(&local_f8,insns.n);
          break;
        case 7:
          iVar8 = mustache_buffer_append_num(&insns,2);
          piVar18 = (int *)local_f8.data;
          piVar25 = (int *)insns.data;
          if (((iVar8 == 0) &&
              (iVar8 = mustache_stack_push(&local_f8,insns.n), piVar18 = (int *)local_f8.data,
              piVar25 = (int *)insns.data, iVar8 == 0)) &&
             (iVar8 = mustache_compile_tagname
                                (&insns,templ_data + *(long *)(piVar19 + 10),
                                 *(long *)(piVar19 + 0xc) - *(long *)(piVar19 + 10)),
             piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 == 0)) {
            uStack_1d0 = 8;
            goto LAB_00107d6d;
          }
          goto LAB_00107ef3;
        case 8:
          iVar8 = mustache_buffer_append_num(&insns,7);
          sVar13 = local_f8.n;
          puVar6 = local_f8.data;
          piVar18 = (int *)local_f8.data;
          piVar25 = (int *)insns.data;
          if ((iVar8 == 0) &&
             (iVar8 = mustache_buffer_append_num
                                (&insns,insns.n - *(long *)((long)local_f8.data + (local_f8.n - 8)))
             , piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 == 0)) {
            off = *(off_t *)((long)puVar6 + (sVar13 - 0x10));
            local_f8.n = sVar13 - 0x10;
            goto LAB_00107d98;
          }
          goto LAB_00107ef3;
        case 9:
          off = *(off_t *)((long)local_f8.data + (local_f8.n - 8));
          local_f8.n = local_f8.n - 8;
LAB_00107d98:
          iVar8 = mustache_buffer_insert_num(&insns,off,insns.n - off);
          break;
        case 10:
          iVar8 = mustache_buffer_append_num(&insns,9);
          piVar18 = (int *)local_f8.data;
          piVar25 = (int *)insns.data;
          if (((iVar8 != 0) ||
              (iVar8 = mustache_buffer_append_num
                                 (&insns,*(long *)(piVar19 + 0xc) - *(long *)(piVar19 + 10)),
              piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 != 0)) ||
             (iVar8 = mustache_buffer_append
                                (&insns,templ_data + *(long *)(piVar19 + 10),
                                 *(long *)(piVar19 + 0xc) - *(long *)(piVar19 + 10)),
             piVar18 = (int *)local_f8.data, piVar25 = (int *)insns.data, iVar8 != 0))
          goto LAB_00107ef3;
          num = 0;
          while (((ulong)(byte)templ_data[num + *(long *)(piVar19 + 6)] < 0x21 &&
                 ((0x100001a00U >> ((ulong)(byte)templ_data[num + *(long *)(piVar19 + 6)] & 0x3f) &
                  1) != 0))) {
            num = num + 1;
          }
          iVar8 = mustache_buffer_append_num(&insns,num);
          piVar18 = (int *)local_f8.data;
          piVar25 = (int *)insns.data;
          if (iVar8 != 0) goto LAB_00107ef3;
          iVar8 = mustache_buffer_append(&insns,templ_data + *(long *)(piVar19 + 6),num);
          break;
        case 0xb:
          uStack_1d0 = 10;
LAB_00107d6d:
          iVar8 = mustache_buffer_append_num(&insns,uStack_1d0);
        }
        piVar18 = (int *)local_f8.data;
        piVar25 = (int *)insns.data;
        if (iVar8 != 0) goto LAB_00107ef3;
switchD_00107c6a_caseD_1:
        lVar26 = *(long *)(piVar19 + 8);
        piVar19 = piVar19 + 0xe;
      } while( true );
    }
  }
LAB_00107ede:
  free(local_b8.data);
  piVar23 = (int *)0x0;
  piVar18 = (int *)0x0;
  piVar25 = (int *)0x0;
LAB_00107ef3:
  free(piVar23);
  piVar19 = piVar25;
  piVar23 = piVar18;
  pMVar27 = (MUSTACHE_TEMPLATE *)0x0;
LAB_00107f04:
  free(piVar23);
  free(piVar19);
  return pMVar27;
}

Assistant:

MUSTACHE_TEMPLATE*
mustache_compile(const char* templ_data, size_t templ_size,
                 const MUSTACHE_PARSER* parser, void* parser_data,
                 unsigned flags)
{
    static const MUSTACHE_PARSER default_parser = { mustache_parse_error };
    MUSTACHE_TAGINFO* tags = NULL;
    unsigned n_tags;
    off_t off;
    off_t jmp_pos;
    MUSTACHE_TAGINFO* tag;
    MUSTACHE_BUFFER insns = { 0 };
    MUSTACHE_STACK jmp_pos_stack = { 0 };
    int done = 0;
    int success = 0;
    size_t indent_len;

    if(parser == NULL)
        parser = &default_parser;

    /* Collect all tags from the template. */
    if(mustache_parse(templ_data, templ_size, parser, parser_data, &tags, &n_tags) != 0)
        goto err;

    /* Build the template */
#define APPEND(data, n)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append(&insns, (data), (n)) != 0)                        \
                goto err;                                                               \
        } while(0)

#define APPEND_NUM(num)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append_num(&insns, (uint64_t)(num)) != 0)                \
                goto err;                                                               \
        } while(0)

#define APPEND_TAGNAME(tag)                                                             \
        do {                                                                            \
            if(mustache_compile_tagname(&insns, templ_data + (tag)->name_beg,           \
                                        (tag)->name_end - (tag)->name_beg) != 0)        \
                goto err;                                                               \
        } while(0)

#define INSERT_NUM(pos, num)                                                            \
        do {                                                                            \
            if(mustache_buffer_insert_num(&insns, (pos), (uint64_t)(num)) != 0)         \
                goto err;                                                               \
        } while(0)

#define PUSH_JMP_POS()                                                                  \
        do {                                                                            \
            if(mustache_stack_push(&jmp_pos_stack, insns.n) != 0)                       \
                goto err;                                                               \
        } while(0)

#define POP_JMP_POS()       ((off_t) mustache_stack_pop(&jmp_pos_stack))

    off = 0;
    tag = &tags[0];
    while(1) {
        if(off < tag->beg) {
            /* Handle literal text before the next tag. */
            APPEND_NUM(MUSTACHE_OP_LITERAL);
            APPEND_NUM(tag->beg - off);
            APPEND(templ_data + off, tag->beg - off);
            off = tag->beg;
        }

        switch(tag->type) {
        case MUSTACHE_TAGTYPE_VAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR2:
            APPEND_NUM(MUSTACHE_OP_RESOLVE);
            APPEND_TAGNAME(tag);
            APPEND_NUM((tag->type == MUSTACHE_TAGTYPE_VAR) ?
                        MUSTACHE_OP_OUTESCAPED : MUSTACHE_OP_OUTVERBATIM);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTION:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTER);
            PUSH_JMP_POS();
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTION:
            APPEND_NUM(MUSTACHE_OP_LEAVE);
            APPEND_NUM(insns.n - POP_JMP_POS());
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTIONINV:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTERINV);
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTIONINV:
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_PARTIAL:
            APPEND_NUM(MUSTACHE_OP_PARTIAL);
            APPEND_NUM(tag->name_end - tag->name_beg);
            APPEND(templ_data + tag->name_beg, tag->name_end - tag->name_beg);
            indent_len = 0;
            while(MUSTACHE_ISWHITESPACE(templ_data[tag->beg + indent_len]))
                indent_len++;
            APPEND_NUM(indent_len);
            APPEND(templ_data + tag->beg, indent_len);
            break;

        case MUSTACHE_TAGTYPE_INDENT:
            APPEND_NUM(MUSTACHE_OP_INDENT);
            break;

        case MUSTACHE_TAGTYPE_NONE:
            APPEND_NUM(MUSTACHE_OP_EXIT);
            done = 1;
            break;

        default:
            break;
        }

        if(done)
            break;

        off = tag->end;
        tag++;
    }

    success = 1;

err:
    free(tags);
    mustache_buffer_free(&jmp_pos_stack);
    if(success) {
        return (MUSTACHE_TEMPLATE*) insns.data;
    } else {
        mustache_buffer_free(&insns);
        return NULL;
    }
}